

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float16 float16_sqrt_x86_64(float16 a,float_status *status)

{
  _Bool _Var1;
  float16 fVar2;
  long lVar3;
  ulong uVar4;
  FloatParts pr;
  FloatParts pa;
  float_status *status_local;
  float16 a_local;
  ulong local_90;
  uint64_t t_frac;
  uint64_t q;
  int last_bit;
  int bit;
  uint64_t s_frac;
  uint64_t r_frac;
  uint64_t a_frac;
  int local_20;
  FloatClass FStack_1c;
  _Bool _Stack_1b;
  undefined2 uStack_1a;
  FloatParts local_18;
  
  local_18 = float16a_unpack_canonical(a,status,&float16_params);
  local_90 = local_18.frac;
  local_20 = local_18.exp;
  FStack_1c = local_18.cls;
  _Stack_1b = local_18.sign;
  uStack_1a = local_18._14_2_;
  _Var1 = is_nan(FStack_1c);
  if (_Var1) {
    local_18 = return_nan(local_18,status);
  }
  else if (FStack_1c != float_class_zero) {
    if (((undefined1  [16])local_18 & (undefined1  [16])0x10000000000) == (undefined1  [16])0x0) {
      if (FStack_1c != float_class_inf) {
        if (FStack_1c != float_class_normal) {
          __assert_fail("a.cls == float_class_normal",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                        ,0xc5f,"FloatParts sqrt_float(FloatParts, float_status *, const FloatFmt *)"
                       );
        }
        r_frac = local_90;
        if (((undefined1  [16])local_18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          r_frac = local_90 >> 1;
        }
        s_frac = 0;
        _last_bit = 0;
        q._4_4_ = 0x3d;
        do {
          lVar3 = 1L << ((byte)q._4_4_ & 0x3f);
          uVar4 = _last_bit + lVar3;
          if (uVar4 <= r_frac) {
            _last_bit = uVar4 + lVar3;
            r_frac = r_frac - uVar4;
            s_frac = lVar3 + s_frac;
          }
          r_frac = r_frac << 1;
          q._4_4_ = q._4_4_ + -1;
        } while (0x2f < q._4_4_);
        local_18.cls = 2;
        local_18.exp = local_20 >> 1;
        local_18.sign = _Stack_1b;
        local_18._14_2_ = uStack_1a;
        local_18.frac = s_frac * 2 + (long)(int)(uint)(r_frac != 0);
      }
    }
    else {
      status->float_exception_flags = status->float_exception_flags | 1;
      local_18 = parts_default_nan(status);
    }
  }
  fVar2 = float16a_round_pack_canonical(local_18,status,&float16_params);
  return fVar2;
}

Assistant:

float16 QEMU_FLATTEN float16_sqrt(float16 a, float_status *status)
{
    FloatParts pa = float16_unpack_canonical(a, status);
    FloatParts pr = sqrt_float(pa, status, &float16_params);
    return float16_round_pack_canonical(pr, status);
}